

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O3

void __thiscall NULLCMemory::write_int(NULLCMemory *this,NULLCArray buffer,int offset,int value)

{
  uint uVar1;
  char *error;
  
  uVar1 = buffer.len;
  if (this == (NULLCMemory *)0x0) {
    error = "buffer is empty";
  }
  else if ((int)uVar1 < 0) {
    error = "offset is negative";
  }
  else {
    if (uVar1 < (uint)buffer.ptr && 3 < (uint)buffer.ptr - uVar1) {
      *(int *)(this + uVar1) = offset;
      return;
    }
    error = "buffer overflow";
  }
  nullcThrowError(error);
  return;
}

Assistant:

bool check_access(NULLCArray buffer, int offset, unsigned readSizeLog2, int elements)
	{
		if(!buffer.ptr)
		{
			nullcThrowError("buffer is empty");
			return false;
		}

		if(offset < 0)
		{
			nullcThrowError("offset is negative");
			return false;
		}

		if(elements < 0)
		{
			nullcThrowError("element count is negative");
			return false;
		}

		if(unsigned(offset) >= buffer.len)
		{
			nullcThrowError("buffer overflow");
			return false;
		}

		unsigned availableElements = ((buffer.len - offset) >> readSizeLog2);

		if(unsigned(elements) > availableElements)
		{
			nullcThrowError("buffer overflow");
			return false;
		}